

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_union_vec_ref_t flatcc_builder_end_union_vector(flatcc_builder_t *B)

{
  size_t count_00;
  flatcc_builder_ref_t *data;
  void *pvVar1;
  size_t count;
  size_t i;
  flatcc_builder_ref_t *refs;
  flatcc_builder_union_ref_t *urefs;
  flatcc_builder_utype_t *types;
  flatcc_builder_t *B_local;
  flatcc_builder_union_vec_ref_t uvref;
  
  memset(&B_local,0,8);
  if (B->frame->type != 7) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_union_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x676,
                  "flatcc_builder_union_vec_ref_t flatcc_builder_end_union_vector(flatcc_builder_t *)"
                 );
  }
  count_00 = flatcc_builder_union_vector_count(B);
  data = (flatcc_builder_ref_t *)push_ds(B,(int)count_00 * 5);
  if (data != (flatcc_builder_ref_t *)0x0) {
    pvVar1 = flatcc_builder_union_vector_edit(B);
    for (count = 0; count < count_00; count = count + 1) {
      *(undefined1 *)((long)(data + count_00) + count) = *(undefined1 *)((long)pvVar1 + count * 8);
      data[count] = *(flatcc_builder_ref_t *)((long)pvVar1 + count * 8 + 4);
    }
    B_local = (flatcc_builder_t *)
              flatcc_builder_create_union_vector_direct
                        (B,(flatcc_builder_utype_t *)(data + count_00),data,count_00);
    exit_frame(B);
  }
  return (flatcc_builder_union_vec_ref_t)B_local;
}

Assistant:

flatcc_builder_union_vec_ref_t flatcc_builder_end_union_vector(flatcc_builder_t *B)
{
    flatcc_builder_union_vec_ref_t uvref = { 0, 0 };
    flatcc_builder_utype_t *types;
    flatcc_builder_union_ref_t *urefs;
    flatcc_builder_ref_t *refs;
    size_t i, count;

    check(frame(type) == flatcc_builder_union_vector, "expected union vector frame");

    /*
     * We could split the union vector in-place, but then we would have
     * to deal with strict pointer aliasing rules which is not worthwhile
     * so we create a new offset and type vector on the stack.
     *
     * We assume the stack is sufficiently aligned as is.
     */
    count = flatcc_builder_union_vector_count(B);
    if (0 == (refs = push_ds(B, (uoffset_t)(count * (utype_size + field_size))))) {
        return uvref;
    }
    types = (flatcc_builder_utype_t *)(refs + count);

    /* Safe even if push_ds caused stack reallocation. */
    urefs = flatcc_builder_union_vector_edit(B);

    for (i = 0; i < count; ++i) {
        types[i] = urefs[i].type;
        refs[i] = urefs[i].value;
    }
    uvref = flatcc_builder_create_union_vector_direct(B, types, refs, count);
    /* No need to clean up after out temporary types vector. */
    exit_frame(B);
    return uvref;
}